

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::write
          (BlockedPumpTo *this,int __fd,void *__buf,size_t __n)

{
  ArrayDisposer **params;
  RemoveConst<kj::Exception::Detail> *pRVar1;
  Detail *pDVar2;
  _func_int *p_Var3;
  PromiseArenaMember *pPVar4;
  ulong uVar5;
  ArrayDisposer *pAVar6;
  PromiseBase PVar7;
  Fault FVar8;
  RemoveConst<kj::Exception::Detail> *pRVar9;
  void *pvVar10;
  RemoveConst<kj::Exception::Detail> *pRVar11;
  ulong *puVar12;
  _func_int *p_Var13;
  size_t sVar14;
  undefined4 in_register_00000034;
  Detail *pDVar15;
  TransformPromiseNodeBase *pTVar16;
  OwnPromiseNode OVar17;
  _func_int **pp_Var18;
  _func_int *p_Var19;
  OwnPromiseNode intermediate;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_97;
  TransformPromiseNodeBase *local_90;
  PromiseBase local_88;
  PromiseBase local_80;
  PromiseArenaMember *local_78;
  Fault f;
  RemoveConst<kj::Exception::Detail> *local_40;
  PromiseBase local_38;
  
  pDVar15 = (Detail *)CONCAT44(in_register_00000034,__fd);
  _kjCondition.value = pDVar15[1].value.disposer == (ArrayDisposer *)0x0;
  if (!_kjCondition.value) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ee,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  params = &pDVar15[1].value.disposer;
  pRVar9 = (RemoveConst<kj::Exception::Detail> *)(pDVar15[1].value.ptr + -pDVar15[1].value.size_);
  if (__n == 0) {
    local_40 = (RemoveConst<kj::Exception::Detail> *)0x0;
  }
  else {
    puVar12 = (ulong *)((long)__buf + 8);
    sVar14 = 0;
    local_40 = (RemoveConst<kj::Exception::Detail> *)0x0;
    pRVar11 = pRVar9;
    do {
      pRVar1 = (RemoveConst<kj::Exception::Detail> *)*puVar12;
      if (pRVar11 < pRVar1) {
        (**(code **)(*(long *)pDVar15[1].id + 8))(this,(long *)pDVar15[1].id,__buf,sVar14);
        if (pRVar11 == (RemoveConst<kj::Exception::Detail> *)0x0) {
          p_Var19 = (_func_int *)(pDVar15->value).size_;
          pp_Var18 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                     _vptr_AsyncInputStream;
          p_Var3 = pp_Var18[1];
          if (p_Var3 == (_func_int *)0x0 || (ulong)((long)pp_Var18 - (long)p_Var3) < 0x38) {
            pvVar10 = operator_new(0x400);
            OVar17.ptr = (PromiseNode *)((long)pvVar10 + 0x3c8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      ((TransformPromiseNodeBase *)OVar17.ptr,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1289:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                       ::anon_class_8_1_8991fb9c_for_func::operator());
            *(undefined ***)((long)pvVar10 + 0x3c8) = &PTR_destroy_006220a8;
            *(Detail **)((long)pvVar10 + 1000) = pDVar15;
            *(_func_int **)((long)pvVar10 + 0x3f0) = p_Var19;
            *(ArrayDisposer ***)((long)pvVar10 + 0x3f8) = params;
            *(void **)((long)pvVar10 + 0x3d0) = pvVar10;
          }
          else {
            pp_Var18[1] = (_func_int *)0x0;
            OVar17.ptr = (PromiseNode *)(pp_Var18 + -7);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      ((TransformPromiseNodeBase *)OVar17.ptr,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1289:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                       ::anon_class_8_1_8991fb9c_for_func::operator());
            pp_Var18[-7] = (_func_int *)&PTR_destroy_006220a8;
            pp_Var18[-3] = (_func_int *)pDVar15;
            pp_Var18[-2] = p_Var19;
            pp_Var18[-1] = (_func_int *)params;
            pp_Var18[-6] = p_Var3;
          }
          local_80.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar17.ptr;
          kj::_::PromiseDisposer::
          alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
                    ((PromiseDisposer *)&f,(Canceler *)params,(Promise<void> *)&local_80);
          pPVar4 = (PromiseArenaMember *)
                   (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
          (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (_func_int **)f.exception;
          f.exception = (Exception *)0x0;
          if ((pPVar4 != (PromiseArenaMember *)0x0) &&
             (kj::_::PromiseDisposer::dispose(pPVar4), FVar8 = f, f.exception != (Exception *)0x0))
          {
            f.exception = (Exception *)0x0;
            kj::_::PromiseDisposer::dispose((PromiseArenaMember *)FVar8.exception);
          }
          PVar7.node.ptr = local_80.node.ptr;
          if (local_80.node.ptr != (PromiseNode *)0x0) {
            local_80.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar7.node.ptr);
          }
        }
        else {
          p_Var19 = (_func_int *)puVar12[-1];
          pp_Var18 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                     _vptr_AsyncInputStream;
          p_Var3 = pp_Var18[1];
          if (p_Var3 == (_func_int *)0x0 || (ulong)((long)pp_Var18 - (long)p_Var3) < 0x38) {
            pvVar10 = operator_new(0x400);
            local_90 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (local_90,(OwnPromiseNode *)this,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1276:36)>
                       ::anon_class_24_2_9ee7ec2e_for_func::operator());
            *(undefined ***)((long)pvVar10 + 0x3c8) = &PTR_destroy_00621ff8;
            *(Detail **)((long)pvVar10 + 1000) = pDVar15;
            *(_func_int **)((long)pvVar10 + 0x3f0) = p_Var19;
            *(RemoveConst<kj::Exception::Detail> **)((long)pvVar10 + 0x3f8) = pRVar11;
            *(void **)((long)pvVar10 + 0x3d0) = pvVar10;
          }
          else {
            pp_Var18[1] = (_func_int *)0x0;
            local_90 = (TransformPromiseNodeBase *)(pp_Var18 + -7);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (local_90,(OwnPromiseNode *)this,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1276:36)>
                       ::anon_class_24_2_9ee7ec2e_for_func::operator());
            pp_Var18[-7] = (_func_int *)&PTR_destroy_00621ff8;
            pp_Var18[-3] = (_func_int *)pDVar15;
            pp_Var18[-2] = p_Var19;
            pp_Var18[-1] = (_func_int *)pRVar11;
            pp_Var18[-6] = p_Var3;
          }
          intermediate.ptr = &local_90->super_PromiseNode;
          f.exception = (Exception *)&DAT_0048a171;
          kj::_::PromiseDisposer::
          appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                    ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
          OVar17 = intermediate;
          pp_Var18 = (_func_int **)CONCAT71(uStack_97,_kjCondition.value);
          if (intermediate.ptr != (PromiseNode *)0x0) {
            intermediate.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar17.ptr)->super_PromiseArenaMember);
          }
          pPVar4 = (PromiseArenaMember *)
                   (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
          (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = pp_Var18;
          if (pPVar4 != (PromiseArenaMember *)0x0) {
            kj::_::PromiseDisposer::dispose(pPVar4);
            pp_Var18 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.
                       super_AsyncInputStream._vptr_AsyncInputStream;
          }
          uVar5 = *puVar12;
          p_Var13 = (_func_int *)((long)&pRVar11->id + puVar12[-1]);
          p_Var19 = (_func_int *)(pDVar15->value).size_;
          p_Var3 = pp_Var18[1];
          if (p_Var3 == (_func_int *)0x0 || (ulong)((long)pp_Var18 - (long)p_Var3) < 0x48) {
            pvVar10 = operator_new(0x400);
            pTVar16 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3b8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar16,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1280:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                       ::anon_class_24_2_79c18d0c_for_func::operator());
            *(undefined ***)((long)pvVar10 + 0x3b8) = &PTR_destroy_00622050;
            *(Detail **)((long)pvVar10 + 0x3d8) = pDVar15;
            *(_func_int **)((long)pvVar10 + 0x3e0) = p_Var13;
            *(_func_int **)((long)pvVar10 + 1000) = (_func_int *)(uVar5 - (long)pRVar11);
            *(_func_int **)((long)pvVar10 + 0x3f0) = p_Var19;
            *(ArrayDisposer ***)((long)pvVar10 + 0x3f8) = params;
            *(void **)((long)pvVar10 + 0x3c0) = pvVar10;
          }
          else {
            pp_Var18[1] = (_func_int *)0x0;
            pTVar16 = (TransformPromiseNodeBase *)(pp_Var18 + -9);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar16,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1280:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                       ::anon_class_24_2_79c18d0c_for_func::operator());
            pp_Var18[-9] = (_func_int *)&PTR_destroy_00622050;
            pp_Var18[-5] = (_func_int *)pDVar15;
            pp_Var18[-4] = p_Var13;
            pp_Var18[-3] = (_func_int *)(uVar5 - (long)pRVar11);
            pp_Var18[-2] = p_Var19;
            pp_Var18[-1] = (_func_int *)params;
            pp_Var18[-8] = p_Var3;
          }
          f.exception = (Exception *)anon_var_dwarf_9cffe6;
          intermediate.ptr = &pTVar16->super_PromiseNode;
          kj::_::PromiseDisposer::
          appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                    ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
          OVar17.ptr = intermediate.ptr;
          local_88.node.ptr._1_7_ = uStack_97;
          local_88.node.ptr._0_1_ = _kjCondition.value;
          if (intermediate.ptr != (PromiseNode *)0x0) {
            intermediate.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar17.ptr)->super_PromiseArenaMember);
          }
          kj::_::PromiseDisposer::
          alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
                    ((PromiseDisposer *)&local_78,(Canceler *)params,(Promise<void> *)&local_88);
          pPVar4 = (PromiseArenaMember *)
                   (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
          (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (_func_int **)local_78;
          local_78 = (PromiseArenaMember *)0x0;
          if ((pPVar4 != (PromiseArenaMember *)0x0) &&
             (kj::_::PromiseDisposer::dispose(pPVar4), pPVar4 = local_78,
             local_78 != (PromiseArenaMember *)0x0)) {
            local_78 = (PromiseArenaMember *)0x0;
            kj::_::PromiseDisposer::dispose(pPVar4);
          }
          PVar7.node.ptr = local_88.node.ptr;
          if (local_88.node.ptr != (PromiseNode *)0x0) {
            local_88.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar7.node.ptr);
          }
          sVar14 = sVar14 + 1;
        }
        p_Var19 = (_func_int *)(__n - sVar14);
        if (p_Var19 == (_func_int *)0x0) {
          return (ssize_t)this;
        }
        p_Var13 = (_func_int *)((long)__buf + sVar14 * 0x10);
        pAVar6 = (pDVar15->value).disposer;
        pp_Var18 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
        p_Var3 = pp_Var18[1];
        if (p_Var3 == (_func_int *)0x0 || (ulong)((long)pp_Var18 - (long)p_Var3) < 0x38) {
          pvVar10 = operator_new(0x400);
          pTVar16 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar16,(OwnPromiseNode *)this,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1299:36)>
                     ::anon_class_24_2_c249a869_for_func::operator());
          *(undefined ***)((long)pvVar10 + 0x3c8) = &PTR_destroy_00622100;
          *(ArrayDisposer **)((long)pvVar10 + 1000) = pAVar6;
          *(_func_int **)((long)pvVar10 + 0x3f0) = p_Var13;
          *(_func_int **)((long)pvVar10 + 0x3f8) = p_Var19;
          *(void **)((long)pvVar10 + 0x3d0) = pvVar10;
        }
        else {
          pp_Var18[1] = (_func_int *)0x0;
          pTVar16 = (TransformPromiseNodeBase *)(pp_Var18 + -7);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar16,(OwnPromiseNode *)this,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1299:36)>
                     ::anon_class_24_2_c249a869_for_func::operator());
          pp_Var18[-7] = (_func_int *)&PTR_destroy_00622100;
          pp_Var18[-3] = (_func_int *)pAVar6;
          pp_Var18[-2] = p_Var13;
          pp_Var18[-1] = p_Var19;
          pp_Var18[-6] = p_Var3;
        }
        f.exception = (Exception *)&DAT_0048a171;
        intermediate.ptr = &pTVar16->super_PromiseNode;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
        OVar17.ptr = intermediate.ptr;
        pp_Var18 = (_func_int **)CONCAT71(uStack_97,_kjCondition.value);
        if (intermediate.ptr != (PromiseNode *)0x0) {
          intermediate.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar17.ptr)->super_PromiseArenaMember);
        }
        pPVar4 = (PromiseArenaMember *)
                 (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                 _vptr_AsyncInputStream;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = pp_Var18;
        if (pPVar4 == (PromiseArenaMember *)0x0) {
          return (ssize_t)this;
        }
        kj::_::PromiseDisposer::dispose(pPVar4);
        return (ssize_t)this;
      }
      local_40 = (RemoveConst<kj::Exception::Detail> *)((long)&pRVar1->id + (long)&local_40->id);
      sVar14 = sVar14 + 1;
      puVar12 = puVar12 + 2;
      pRVar11 = (RemoveConst<kj::Exception::Detail> *)((long)pRVar11 - (long)pRVar1);
    } while (__n != sVar14);
  }
  f.exception = (Exception *)&stack0xffffffffffffffc0;
  if (local_40 <= pRVar9) {
    (**(code **)(*(long *)pDVar15[1].id + 8))(&f,(long *)pDVar15[1].id,__buf,__n);
    pRVar9 = local_40;
    FVar8.exception = f.exception;
    pDVar2 = (Detail *)(pDVar15->value).size_;
    pvVar10 = (void *)((f.exception)->ownFile).content.size_;
    if (pvVar10 == (void *)0x0 || (ulong)((long)f.exception - (long)pvVar10) < 0x40) {
      pvVar10 = operator_new(0x400);
      pTVar16 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar16,(OwnPromiseNode *)&f,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1313:54),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                 ::anon_class_16_2_3fe5c9bc_for_func::operator());
      *(undefined ***)((long)pvVar10 + 0x3c0) = &PTR_destroy_00622158;
      *(Detail **)((long)pvVar10 + 0x3e0) = pDVar15;
      *(RemoveConst<kj::Exception::Detail> **)((long)pvVar10 + 1000) = pRVar9;
      *(Detail **)((long)pvVar10 + 0x3f0) = pDVar2;
      *(ArrayDisposer ***)((long)pvVar10 + 0x3f8) = params;
      *(void **)((long)pvVar10 + 0x3c8) = pvVar10;
    }
    else {
      ((f.exception)->ownFile).content.size_ = 0;
      pTVar16 = (TransformPromiseNodeBase *)(FVar8.exception[-1].trace + 0x1d);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar16,(OwnPromiseNode *)&f,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1313:54),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                 ::anon_class_16_2_3fe5c9bc_for_func::operator());
      FVar8.exception[-1].trace[0x1d] = &PTR_destroy_00622158;
      FVar8.exception[-1].details.builder.ptr = pDVar15;
      FVar8.exception[-1].details.builder.pos = pRVar9;
      FVar8.exception[-1].details.builder.endPtr = pDVar2;
      FVar8.exception[-1].details.builder.disposer = (ArrayDisposer *)params;
      FVar8.exception[-1].trace[0x1e] = pvVar10;
    }
    local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)pTVar16;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
              ((PromiseDisposer *)this,(Canceler *)params,(Promise<void> *)&stack0xffffffffffffffc8)
    ;
    OVar17.ptr = (PromiseNode *)local_38.node.ptr;
    if (local_38.node.ptr != (PromiseNode *)0x0) {
      local_38.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar17.ptr)->super_PromiseArenaMember);
    }
    FVar8.exception = f.exception;
    if (f.exception != (Exception *)0x0) {
      f.exception = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)FVar8.exception);
    }
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x520,FAILED,"size <= amount - pumpedSoFar","_kjCondition,",
             (DebugComparison<unsigned_long_&,_unsigned_long> *)&f);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}